

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlunicode.c
# Opt level: O0

int xmlUCSIsCatMe(int code)

{
  bool local_e;
  bool local_d;
  int code_local;
  
  if ((((code < 0x488) || (local_d = true, 0x489 < code)) && (local_d = true, code != 0x6de)) &&
     ((code < 0x20dd || (local_d = true, 0x20e0 < code)))) {
    local_e = 0x20e1 < code && code < 0x20e5;
    local_d = local_e;
  }
  return (int)local_d;
}

Assistant:

int
xmlUCSIsCatMe(int code) {
    return(((code >= 0x488) && (code <= 0x489)) ||
           (code == 0x6de) ||
           ((code >= 0x20dd) && (code <= 0x20e0)) ||
           ((code >= 0x20e2) && (code <= 0x20e4)));
}